

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Lexer::Execute(Lexer *this)

{
  byte bVar1;
  pointer pSVar2;
  bool bVar3;
  char *pcVar4;
  SymbolType SVar5;
  uint uVar6;
  
  pcVar4 = this->m_start;
  this->m_current = pcVar4;
  while( true ) {
    if ((*pcVar4 == '\0') || (this->m_end < pcVar4)) break;
    ParseWhitespace(this);
    bVar1 = *this->m_current;
    if ((bVar1 == 0xd) || (bVar1 == 10)) {
      ParseEndOfLine(this);
      goto LAB_001c832a;
    }
    if ((bVar1 == 0) || (this->m_end < this->m_current)) break;
    uVar6 = (uint)bVar1;
    switch(bVar1) {
    case 0x21:
      bVar3 = IsNextCharacter(this,'=');
      if (bVar3) {
        SVar5 = NotEquals;
LAB_001c8293:
        CreateSymbol(this,SVar5);
        AdvanceCurrent(this);
      }
      else {
        Error<>(this,"Invalid symbol \'!\'");
      }
      goto LAB_001c831c;
    case 0x22:
      ParseString(this);
      goto LAB_001c831c;
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
      goto switchD_001c8179_caseD_23;
    case 0x25:
      SVar5 = Percent;
      break;
    case 0x28:
      SVar5 = ParenOpen;
      break;
    case 0x29:
      SVar5 = ParenClose;
      break;
    case 0x2a:
      SVar5 = Asterisk;
      break;
    case 0x2b:
      bVar3 = IsNextDigit(this);
      if (!bVar3) {
        SVar5 = Plus;
        break;
      }
      AdvanceCurrent(this);
      goto LAB_001c82f1;
    case 0x2c:
      SVar5 = Comma;
      break;
    case 0x2d:
      bVar3 = IsNextCharacter(this,'-');
      if (bVar3) {
        ParseComment(this);
        goto LAB_001c832a;
      }
      bVar3 = IsNextDigit(this);
      if (bVar3) goto LAB_001c82f1;
      SVar5 = Minus;
      break;
    case 0x2e:
      bVar3 = IsNextCharacter(this,'.');
      if (bVar3) {
        ParseEllipse(this);
        goto LAB_001c832a;
      }
      goto switchD_001c8179_caseD_23;
    case 0x2f:
      SVar5 = ForwardSlash;
      break;
    case 0x3c:
      bVar3 = IsNextCharacter(this,'=');
      if (bVar3) {
        SVar5 = LessThanEquals;
        goto LAB_001c8293;
      }
      SVar5 = LessThan;
      break;
    case 0x3d:
      SVar5 = Equals;
      break;
    case 0x3e:
      bVar3 = IsNextCharacter(this,'=');
      if (bVar3) {
        SVar5 = GreaterThanEquals;
        goto LAB_001c8293;
      }
      SVar5 = GreaterThan;
      break;
    default:
      if (bVar1 == 0x5b) {
        SVar5 = SquareOpen;
      }
      else if (bVar1 == 0x5d) {
        SVar5 = SquareClose;
      }
      else if (uVar6 == 0x7b) {
        SVar5 = CurlyOpen;
      }
      else {
        if (uVar6 != 0x7d) goto switchD_001c8179_caseD_23;
        SVar5 = CurlyClose;
      }
    }
    CreateSymbol(this,SVar5);
LAB_001c831c:
    if (this->m_error != false) break;
    AdvanceCurrent(this);
LAB_001c832a:
    pcVar4 = this->m_current;
  }
  pSVar2 = (this->m_symbolList).
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this->m_symbolList).
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>._M_impl.
       super__Vector_impl_data._M_start != pSVar2) && (pSVar2[-1].type != NewLine)) {
    CreateSymbol(this,NewLine);
  }
  return (bool)(this->m_error ^ 1);
switchD_001c8179_caseD_23:
  if ((byte)(bVar1 - 0x2d) < 2 || uVar6 - 0x30 < 10) {
LAB_001c82f1:
    ParseNumber(this);
  }
  else {
    ParseName(this);
  }
  goto LAB_001c832a;
}

Assistant:

inline_t bool Lexer::Execute()
	{
		m_current = m_start;

		// Create a list of tokens for the parser to analyze
		while (!IsEndOfText())
		{
			// Advance past any whitespace
			ParseWhitespace();

			// Check for end of line character
			if (IsNewline(*m_current))
			{
				// Advance past end of line
				ParseEndOfLine();
				continue;
			}

			// May have reached end of text after parsing whitespace or end of line
			if (IsEndOfText())
				break;

			// Check for operators first
			unsigned char c = *m_current;
			switch (c)
			{
			case '-':
				if (IsNextCharacter('-'))
				{
					ParseComment();
					continue;
				}
				else if (IsNextDigit())
				{
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Minus);
				break;
			case '<':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::LessThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::LessThan);
				}
				break;
			case '>':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::GreaterThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::GreaterThan);
				}
				break;
			case '"':
				ParseString();
				break;
			case '*':
				CreateSymbol(SymbolType::Asterisk);
				break;
			case '/':
				CreateSymbol(SymbolType::ForwardSlash);
				break;
			case '+':
				if (IsNextDigit())
				{
					AdvanceCurrent();
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Plus);
				break;
			case '=':
				CreateSymbol(SymbolType::Equals);
				break;
			case '!':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::NotEquals);
					AdvanceCurrent();
				}
				else
				{
					Error("Invalid symbol '!'");
					break;
				}
				break;
			case '%':
				CreateSymbol(SymbolType::Percent);
				break;
			case ',':
				CreateSymbol(SymbolType::Comma);
				break;
			case '(':
				CreateSymbol(SymbolType::ParenOpen);
				break;
			case ')':
				CreateSymbol(SymbolType::ParenClose);
				break;
			case '{':
				CreateSymbol(SymbolType::CurlyOpen);
				break;
			case '}':
				CreateSymbol(SymbolType::CurlyClose);
				break;
			case '[':
				CreateSymbol(SymbolType::SquareOpen);
				break;
			case ']':
				CreateSymbol(SymbolType::SquareClose);
				break;
			default:
			{
				if (c == '.' && IsNextCharacter('.'))
					ParseEllipse();
				else
				{
					if (IsNumberStart(c))
						ParseNumber();
					else
						ParseName();
				}
				continue;
			}
			};

			// Check for errors
			if (m_error)
				break;

			// Advance one UTF-8 character
			AdvanceCurrent();
		}

		// Make sure programs always end with a new line marker for parsing consistency
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);

		// Return error status
		return !m_error;
	}